

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

void Luv24toXYZ(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  float *local_30;
  float *xyz;
  uint32_t *luv;
  tmsize_t n_local;
  uint8_t *op_local;
  LogLuvState *sp_local;
  
  xyz = (float *)sp->tbuf;
  local_30 = (float *)op;
  luv = (uint32_t *)n;
  while (0 < (long)luv) {
    LogLuv24toXYZ((uint32_t)*xyz,local_30);
    local_30 = local_30 + 3;
    xyz = xyz + 1;
    luv = (uint32_t *)((long)luv + -1);
  }
  return;
}

Assistant:

static void Luv24toXYZ(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    float *xyz = (float *)op;

    while (n-- > 0)
    {
        LogLuv24toXYZ(*luv, xyz);
        xyz += 3;
        luv++;
    }
}